

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedCopyImage::Run(AdvancedCopyImage *this)

{
  CallLogWrapper *this_00;
  GLsizei GVar1;
  GLint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  int h;
  int w;
  int iVar6;
  allocator_type local_81;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> rdata;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat)
  ;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat,"g_input_image"
                    );
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat,
                     "g_output_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,1);
  iVar3 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar4 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&rdata,7.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,(long)(iVar3 * iVar4),(value_type *)&rdata,&local_81);
  glu::CallLogWrapper::glBindTexture
            (this_00,0xde1,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  iVar3 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  GVar1 = *(GLsizei *)CONCAT44(extraout_var_01,iVar3);
  iVar3 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8814,GVar1,*(GLsizei *)(CONCAT44(extraout_var_02,iVar3) + 4),0,0x1908
             ,0x1406,data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture
            (this_00,0xde1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  iVar3 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  GVar1 = *(GLsizei *)CONCAT44(extraout_var_03,iVar3);
  iVar3 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8814,GVar1,*(GLsizei *)(CONCAT44(extraout_var_04,iVar3) + 4),0,0x1908
             ,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture
            (this_00,0,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget,0,'\0',0,35000,
             0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (this_00,1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4),0,'\0',0
             ,0x88b9,0x8814);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glBindVertexArray
            (this_00,*(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
  glu::CallLogWrapper::glDrawElementsInstancedBaseInstance(this_00,5,4,0x1403,(void *)0x0,1,0);
  iVar3 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_05,iVar3);
  iVar4 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&rdata,(long)(iVar3 * *(int *)(CONCAT44(extraout_var_06,iVar4) + 4)),&local_81);
  glu::CallLogWrapper::glBindTexture
            (this_00,0xde1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  iVar3 = 0;
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1908,0x1406,
             rdata.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  while( true ) {
    iVar4 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_07,iVar4) + 4);
    if (iVar4 <= iVar3) break;
    iVar6 = 0;
    while (iVar5 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_renderCtx->_vptr_RenderContext[4])(),
          iVar6 < *(int *)CONCAT44(extraout_var_08,iVar5)) {
      iVar5 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                m_renderCtx->_vptr_RenderContext[4])();
      tcu::Vector<float,_4>::Vector
                (&local_70,
                 rdata.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 (*(int *)CONCAT44(extraout_var_09,iVar5) * iVar3 + iVar6));
      tcu::Vector<float,_4>::Vector(&local_80,7.0);
      if (((((local_70.m_data[0] != local_80.m_data[0]) ||
            (NAN(local_70.m_data[0]) || NAN(local_80.m_data[0]))) ||
           (local_70.m_data[1] != local_80.m_data[1])) ||
          ((NAN(local_70.m_data[1]) || NAN(local_80.m_data[1]) ||
           (local_70.m_data[2] != local_80.m_data[2])))) ||
         (NAN(local_70.m_data[2]) || NAN(local_80.m_data[2]))) goto LAB_00a56b50;
      iVar6 = iVar6 + 1;
      if ((local_70.m_data[3] != local_80.m_data[3]) ||
         (NAN(local_70.m_data[3]) || NAN(local_80.m_data[3]))) goto LAB_00a56b50;
    }
    iVar3 = iVar3 + 1;
  }
LAB_00a56b50:
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&rdata.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return -(ulong)(iVar3 < iVar4);
}

Assistant:

virtual long Run()
	{
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_input_image"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_output_image"), 1);

		std::vector<vec4> data(getWindowWidth() * getWindowHeight(), vec4(7.0f));
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 0, GL_RGBA, GL_FLOAT, &data[0]);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 0, GL_RGBA, GL_FLOAT, NULL);

		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glDrawElementsInstancedBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0);

		std::vector<vec4> rdata(getWindowWidth() * getWindowHeight());
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &rdata[0]);

		for (int h = 0; h < getWindowHeight(); ++h)
		{
			for (int w = 0; w < getWindowWidth(); ++w)
			{
				if (!IsEqual(rdata[h * getWindowWidth() + w], vec4(7.0f)))
				{
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}